

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O1

size_t ecs_table_column_size(ecs_iter_t *it,int32_t column_index)

{
  ecs_table_t *peVar1;
  int32_t iVar2;
  size_t sVar3;
  
  _ecs_assert(it->table != (ecs_iter_table_t *)0x0,2,(char *)0x0,"it->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0x10f);
  if (it->table == (ecs_iter_table_t *)0x0) {
    __assert_fail("it->table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0x10f,"size_t ecs_table_column_size(const ecs_iter_t *, int32_t)");
  }
  _ecs_assert(it->table->table != (ecs_table_t *)0x0,0xc,(char *)0x0,"it->table->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0x110);
  peVar1 = it->table->table;
  if (peVar1 == (ecs_table_t *)0x0) {
    __assert_fail("it->table->table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0x110,"size_t ecs_table_column_size(const ecs_iter_t *, int32_t)");
  }
  iVar2 = ecs_vector_count(peVar1->type);
  _ecs_assert(column_index < iVar2,2,(char *)0x0,"column_index < ecs_vector_count(table->type)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0x114);
  iVar2 = ecs_vector_count(peVar1->type);
  if (iVar2 <= column_index) {
    __assert_fail("column_index < ecs_vector_count(table->type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0x114,"size_t ecs_table_column_size(const ecs_iter_t *, int32_t)");
  }
  if (column_index < peVar1->column_count) {
    sVar3 = ecs_to_size_t((long)*(short *)((long)it->table_columns + (long)column_index * 0x10 + 8))
    ;
    return sVar3;
  }
  return 0;
}

Assistant:

size_t ecs_table_column_size(
    const ecs_iter_t *it,
    int32_t column_index)
{
    /* See ecs_iter_type */
    ecs_assert(it->table != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(it->table->table != NULL, ECS_INTERNAL_ERROR, NULL);
    
    ecs_table_t *table = it->table->table;
    ecs_assert(column_index < ecs_vector_count(table->type), 
        ECS_INVALID_PARAMETER, NULL);

    if (table->column_count <= column_index) {
        return 0;
    }

    ecs_column_t *columns = it->table_columns;
    ecs_column_t *column = &columns[column_index];
    
    return ecs_to_size_t(column->size);
}